

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_bitmap.cpp
# Opt level: O3

void addTests_Bitmap(UnitTestFramework *framework)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_30;
  
  paVar1 = &local_30.field_2;
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"Save and load white gray-scale image","");
  UnitTestFramework::add(framework,bitmap_operation::WhiteGrayScaleImage,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"Save and load black gray-scale image","");
  UnitTestFramework::add(framework,bitmap_operation::BlackGrayScaleImage,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"Save and load random RGB image","");
  UnitTestFramework::add(framework,bitmap_operation::RandomRGBImage,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void addTests_Bitmap( UnitTestFramework & framework )
{
    framework.add(bitmap_operation::WhiteGrayScaleImage, "Save and load white gray-scale image");
    framework.add(bitmap_operation::BlackGrayScaleImage, "Save and load black gray-scale image");
    framework.add(bitmap_operation::RandomRGBImage,      "Save and load random RGB image");
}